

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void NULLC::FreePending(void)

{
  int *ptr;
  uint uVar1;
  Range *key;
  uint size;
  markerType *marker;
  void *block;
  Range *curr;
  uint i;
  
  curr._4_4_ = 0;
  while( true ) {
    uVar1 = FastVector<NULLC::Range,_false,_false>::size
                      ((FastVector<NULLC::Range,_false,_false> *)blocksToFree);
    if (uVar1 <= curr._4_4_) break;
    key = FastVector<NULLC::Range,_false,_false>::operator[]
                    ((FastVector<NULLC::Range,_false,_false> *)blocksToFree,curr._4_4_);
    ptr = (int *)key->start;
    if ((*(ulong *)(ptr + 1) & (OBJECT_VISIBLE | OBJECT_FREED)) == 0) {
      usedMemory = usedMemory - *ptr;
      alignedDealloc(ptr);
      Tree<NULLC::Range>::erase((Tree<NULLC::Range> *)bigBlocks,key);
    }
    curr._4_4_ = curr._4_4_ + 1;
  }
  FastVector<NULLC::Range,_false,_false>::clear
            ((FastVector<NULLC::Range,_false,_false> *)blocksToFree);
  ObjectBlockPool<8,_8192>::FreePending((ObjectBlockPool<8,_8192> *)pool8,(uint *)&usedMemory);
  ObjectBlockPool<16,_4096>::FreePending((ObjectBlockPool<16,_4096> *)pool16,(uint *)&usedMemory);
  ObjectBlockPool<32,_2048>::FreePending((ObjectBlockPool<32,_2048> *)pool32,(uint *)&usedMemory);
  ObjectBlockPool<64,_1024>::FreePending((ObjectBlockPool<64,_1024> *)pool64,(uint *)&usedMemory);
  ObjectBlockPool<128,_512>::FreePending((ObjectBlockPool<128,_512> *)pool128,(uint *)&usedMemory);
  ObjectBlockPool<256,_256>::FreePending((ObjectBlockPool<256,_256> *)pool256,(uint *)&usedMemory);
  ObjectBlockPool<512,_128>::FreePending((ObjectBlockPool<512,_128> *)pool512,(uint *)&usedMemory);
  return;
}

Assistant:

void NULLC::FreePending()
{
	for(unsigned i = 0; i < blocksToFree.size(); i++)
	{
		Range &curr = blocksToFree[i];

		void *block = curr.start;

		markerType &marker = *(markerType*)((char*)block + 4);

		// Check flags again, finalizers might have some objects reachable
		if(!(marker & (NULLC::OBJECT_VISIBLE | NULLC::OBJECT_FREED)))
		{
			unsigned size = *(unsigned int*)block;

			usedMemory -= size;

			NULLC::alignedDealloc(block);

			bigBlocks.erase(curr);
		}
	}

	blocksToFree.clear();

	pool8.FreePending(usedMemory);
	pool16.FreePending(usedMemory);
	pool32.FreePending(usedMemory);
	pool64.FreePending(usedMemory);
	pool128.FreePending(usedMemory);
	pool256.FreePending(usedMemory);
	pool512.FreePending(usedMemory);
}